

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O2

void anon_unknown.dwarf_2a8396::writeRead
               (string *tempDir,int W,int H,Compression comp,int xSize,int ySize)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ostream *poVar10;
  undefined4 *puVar11;
  Compression *pCVar12;
  int *piVar13;
  Box<Imath_3_2::Vec2<int>_> *pBVar14;
  Box<Imath_3_2::Vec2<int>_> *pBVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  half *phVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  half *phVar26;
  char *__assertion;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  int level;
  long lVar32;
  float fVar33;
  long local_1c8;
  long local_1a8;
  TiledRgbaOutputFile out;
  half hStack_19e;
  half hStack_19c;
  half hStack_19a;
  Array2D<Imf_3_2::Rgba> p1;
  Array2D<Imf_3_2::Rgba> p2;
  Header header;
  Array2D<Imf_3_2::Rgba> p3;
  Array2D<Imf_3_2::Rgba> local_68;
  string filename;
  
  std::operator+(&filename,tempDir,"imf_test_tiled_rgba.exr");
  _Var1 = filename._M_dataplus;
  poVar10 = std::operator<<((ostream *)&std::cout,"levelMode 0");
  poVar10 = std::operator<<(poVar10,", compression ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,comp);
  poVar10 = std::operator<<(poVar10,", tileSize ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,xSize);
  poVar10 = std::operator<<(poVar10,"x");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,ySize);
  std::endl<char,std::char_traits<char>>(poVar10);
  _out = 0;
  hStack_19e._h = 0;
  hStack_19c._h = 0;
  hStack_19a._h = 0;
  Imf_3_2::Header::Header(&header,W,H,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar11 = (undefined4 *)Imf_3_2::Header::lineOrder();
  *puVar11 = 0;
  pCVar12 = (Compression *)Imf_3_2::Header::compression();
  *pCVar12 = comp;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&p1,(long)H,(long)W);
  std::operator<<((ostream *)&std::cout," writing");
  std::ostream::flush();
  remove(_Var1._M_p);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,_Var1._M_p,&header,WRITE_RGBA,xSize,ySize,ONE_LEVEL,ROUND_DOWN,iVar3);
  fillPixels(&p1,W,H);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
  iVar3 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar4 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_2::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::operator<<((ostream *)&std::cout," reading");
  std::ostream::flush();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var1._M_p,iVar3);
  piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
  iVar3 = *piVar13;
  lVar31 = (long)piVar13[2] - (long)iVar3;
  uVar18 = lVar31 + 1;
  iVar4 = piVar13[1];
  lVar32 = (long)piVar13[3] - (long)iVar4;
  uVar22 = lVar32 + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&p2,uVar22,uVar18);
  Imf_3_2::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(ulong)(p2._data + (-(long)iVar4 * p2._sizeY - (long)iVar3)),1);
  iVar3 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&out);
  iVar4 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&out);
  Imf_3_2::TiledRgbaInputFile::readTiles((int)&out,0,iVar3 + -1,0,iVar4 + -1);
  poVar10 = std::operator<<((ostream *)&std::cout," comparing");
  std::endl<char,std::char_traits<char>>(poVar10);
  std::ostream::flush();
  pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::TiledRgbaInputFile::displayWindow();
  pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
  if (bVar2) {
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
    if (bVar2) {
      fVar33 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
      pfVar16 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
        __assertion = "in.pixelAspectRatio () == header.pixelAspectRatio ()";
        uVar5 = 0x68;
      }
      else {
        Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
        pfVar16 = (float *)Imf_3_2::Header::screenWindowCenter();
        if (((((float)p3._sizeX != *pfVar16) || (NAN((float)p3._sizeX) || NAN(*pfVar16))) ||
            (p3._sizeX._4_4_ != pfVar16[1])) || (NAN(p3._sizeX._4_4_) || NAN(pfVar16[1]))) {
          __assertion = "in.screenWindowCenter () == header.screenWindowCenter ()";
          uVar5 = 0x69;
        }
        else {
          fVar33 = (float)Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
          pfVar16 = (float *)Imf_3_2::Header::screenWindowWidth();
          if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
            __assertion = "in.screenWindowWidth () == header.screenWindowWidth ()";
            uVar5 = 0x6a;
          }
          else {
            iVar3 = Imf_3_2::TiledRgbaInputFile::lineOrder();
            piVar13 = (int *)Imf_3_2::Header::lineOrder();
            if (iVar3 == *piVar13) {
              iVar3 = Imf_3_2::TiledRgbaInputFile::compression();
              piVar13 = (int *)Imf_3_2::Header::compression();
              if (iVar3 == *piVar13) {
                iVar3 = Imf_3_2::TiledRgbaInputFile::channels();
                if (iVar3 == 0xf) {
                  lVar28 = (long)(int)lVar31;
                  lVar31 = (long)(int)lVar32;
                  if (comp - B44_COMPRESSION < 4) {
                    local_1a8 = 0;
                    uVar21 = uVar22 & 0xffffffff;
                    lVar32 = 0;
                    while( true ) {
                      uVar8 = (uint)uVar21;
                      uVar5 = uVar8;
                      if (ySize < (int)uVar8) {
                        uVar5 = ySize;
                      }
                      if ((int)uVar5 < 1) {
                        uVar5 = 0;
                      }
                      if (lVar31 < lVar32) break;
                      iVar3 = (int)uVar22 - (int)lVar32;
                      if (ySize <= iVar3) {
                        iVar3 = ySize;
                      }
                      lVar30 = 0;
                      uVar21 = uVar18 & 0xffffffff;
                      lVar27 = 0;
                      while( true ) {
                        uVar24 = (uint)uVar21;
                        uVar29 = uVar24;
                        if (xSize < (int)uVar24) {
                          uVar29 = xSize;
                        }
                        if ((int)uVar29 < 1) {
                          uVar29 = 0;
                        }
                        if (lVar28 < lVar27) break;
                        iVar4 = (int)uVar18 - (int)lVar27;
                        if (xSize <= iVar4) {
                          iVar4 = xSize;
                        }
                        Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&p3,(long)iVar3,(long)iVar4);
                        Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&local_68,(long)iVar3,(long)iVar4);
                        lVar19 = 0;
                        lVar17 = local_1a8;
                        for (uVar21 = 0; uVar21 != uVar5; uVar21 = uVar21 + 1) {
                          for (uVar23 = 0; uVar29 != uVar23; uVar23 = uVar23 + 1) {
                            *(undefined8 *)((long)&p3._data[uVar23].r._h + p3._sizeY * lVar19) =
                                 *(undefined8 *)
                                  ((long)&p1._data[uVar23].r._h + lVar30 + p1._sizeY * lVar17);
                            *(undefined8 *)
                             ((long)&local_68._data[uVar23].r._h + local_68._sizeY * lVar19) =
                                 *(undefined8 *)
                                  ((long)&p2._data[uVar23].r._h + lVar30 + p2._sizeY * lVar17);
                          }
                          lVar19 = lVar19 + 8;
                          lVar17 = lVar17 + 8;
                        }
                        if ((comp & ~RLE_COMPRESSION) == B44_COMPRESSION) {
                          compareB44(iVar4,iVar3,&p3,&local_68,WRITE_RGBA);
                        }
                        else if ((comp & (DWAA_COMPRESSION|B44_COMPRESSION)) == DWAA_COMPRESSION) {
                          compareDwa(iVar4,iVar3,&p3,&local_68,WRITE_RGBA);
                        }
                        Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&local_68);
                        Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p3);
                        lVar27 = lVar27 + xSize;
                        uVar21 = (ulong)(uVar24 - xSize);
                        lVar30 = lVar30 + (long)xSize * 8;
                      }
                      lVar32 = lVar32 + ySize;
                      uVar21 = (ulong)(uVar8 - ySize);
                      local_1a8 = local_1a8 + (long)ySize * 8;
                    }
                  }
                  else {
                    phVar26 = &(p1._data)->a;
                    phVar20 = &(p2._data)->a;
                    for (lVar32 = 0; lVar32 <= lVar31; lVar32 = lVar32 + 1) {
                      lVar27 = 0;
                      while (lVar27 <= lVar28) {
                        fVar33 = *(float *)(_imath_half_to_float_table +
                                           (ulong)phVar20[lVar27 * 4 + -3]._h * 4);
                        pfVar16 = (float *)(_imath_half_to_float_table +
                                           (ulong)phVar26[lVar27 * 4 + -3]._h * 4);
                        if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                          __assert_fail("p2[y][x].r == p1[y][x].r",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                        ,0x98,
                                        "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                                       );
                        }
                        fVar33 = *(float *)(_imath_half_to_float_table +
                                           (ulong)phVar20[lVar27 * 4 + -2]._h * 4);
                        pfVar16 = (float *)(_imath_half_to_float_table +
                                           (ulong)phVar26[lVar27 * 4 + -2]._h * 4);
                        if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                          __assert_fail("p2[y][x].g == p1[y][x].g",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                        ,0x9d,
                                        "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                                       );
                        }
                        fVar33 = *(float *)(_imath_half_to_float_table +
                                           (ulong)phVar20[lVar27 * 4 + -1]._h * 4);
                        pfVar16 = (float *)(_imath_half_to_float_table +
                                           (ulong)phVar26[lVar27 * 4 + -1]._h * 4);
                        if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                          __assert_fail("p2[y][x].b == p1[y][x].b",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                        ,0xa2,
                                        "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                                       );
                        }
                        fVar33 = *(float *)(_imath_half_to_float_table +
                                           (ulong)phVar20[lVar27 * 4]._h * 4);
                        lVar30 = lVar27 * 4;
                        lVar27 = lVar27 + 1;
                        pfVar16 = (float *)(_imath_half_to_float_table +
                                           (ulong)phVar26[lVar30]._h * 4);
                        if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                          __assert_fail("p2[y][x].a == p1[y][x].a",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                        ,0xa7,
                                        "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
                                       );
                        }
                      }
                      phVar26 = phVar26 + p1._sizeY * 4;
                      phVar20 = phVar20 + p2._sizeY * 4;
                    }
                  }
                  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p2);
                  Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
                  remove(_Var1._M_p);
                  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p1);
                  Imf_3_2::Header::~Header(&header);
                  _Var1 = filename._M_dataplus;
                  if (comp - NUM_COMPRESSION_METHODS < 0xfffffffc) {
                    poVar10 = std::operator<<((ostream *)&std::cout,"levelMode 1");
                    poVar10 = std::operator<<(poVar10,", compression ");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,comp);
                    poVar10 = std::operator<<(poVar10,", tileSize ");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,xSize);
                    poVar10 = std::operator<<(poVar10,"x");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,ySize);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    _out = 0;
                    hStack_19e._h = 0;
                    hStack_19c._h = 0;
                    hStack_19a._h = 0;
                    Imf_3_2::Header::Header
                              (&header,W,H,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
                    puVar11 = (undefined4 *)Imf_3_2::Header::lineOrder();
                    *puVar11 = 0;
                    pCVar12 = (Compression *)Imf_3_2::Header::compression();
                    *pCVar12 = comp;
                    p1._sizeX = 0;
                    p1._sizeY = 0;
                    std::operator<<((ostream *)&std::cout," writing");
                    std::ostream::flush();
                    remove(_Var1._M_p);
                    iVar3 = Imf_3_2::globalThreadCount();
                    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                              (&out,_Var1._M_p,&header,WRITE_RGBA,xSize,ySize,MIPMAP_LEVELS,
                               ROUND_DOWN,iVar3);
                    iVar3 = Imf_3_2::TiledRgbaOutputFile::numLevels();
                    Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::resizeErase
                              ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p1,(long)iVar3);
                    lVar31 = 0;
                    for (lVar32 = 0; iVar3 = Imf_3_2::TiledRgbaOutputFile::numLevels(),
                        lVar32 < iVar3; lVar32 = lVar32 + 1) {
                      iVar6 = (int)(Rgba *)&out;
                      iVar3 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar6);
                      iVar4 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar6);
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase
                                ((Array2D<Imf_3_2::Rgba> *)(p1._sizeY + lVar31),(long)iVar4,
                                 (long)iVar3);
                      fillPixels((Array2D<Imf_3_2::Rgba> *)(p1._sizeY + lVar31),iVar3,iVar4);
                      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer
                                ((Rgba *)&out,*(ulong *)(p1._sizeY + 0x10 + lVar31),1);
                      iVar3 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar6);
                      iVar4 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar6);
                      Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar6,0,iVar3 + -1,0,iVar4 + -1);
                      lVar31 = lVar31 + 0x18;
                    }
                    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
                    std::operator<<((ostream *)&std::cout," reading");
                    std::ostream::flush();
                    iVar3 = Imf_3_2::globalThreadCount();
                    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                              ((TiledRgbaInputFile *)&out,_Var1._M_p,iVar3);
                    piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
                    iVar3 = *piVar13;
                    iVar4 = piVar13[1];
                    uVar5 = Imf_3_2::TiledRgbaInputFile::numLevels();
                    uVar18 = (ulong)uVar5;
                    Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::Array
                              ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p2,(long)(int)uVar5);
                    if ((int)uVar5 < 1) {
                      uVar18 = 0;
                    }
                    for (lVar31 = 0; uVar18 * 0x18 - lVar31 != 0; lVar31 = lVar31 + 0x18) {
                      iVar9 = (int)(Rgba *)&out;
                      iVar6 = Imf_3_2::TiledRgbaInputFile::levelWidth(iVar9);
                      iVar7 = Imf_3_2::TiledRgbaInputFile::levelHeight(iVar9);
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase
                                ((Array2D<Imf_3_2::Rgba> *)(p2._sizeY + lVar31),(long)iVar7,
                                 (long)iVar6);
                      Imf_3_2::TiledRgbaInputFile::setFrameBuffer
                                ((Rgba *)&out,
                                 *(long *)(p2._sizeY + 8 + lVar31) * -(long)iVar4 * 8 +
                                 *(long *)(p2._sizeY + 0x10 + lVar31) + (long)iVar3 * -8,1);
                      iVar6 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar9);
                      iVar7 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar9);
                      Imf_3_2::TiledRgbaInputFile::readTiles(iVar9,0,iVar6 + -1,0,iVar7 + -1);
                    }
                    poVar10 = std::operator<<((ostream *)&std::cout," comparing");
                    std::endl<char,std::char_traits<char>>(poVar10);
                    std::ostream::flush();
                    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)
                              Imf_3_2::TiledRgbaInputFile::displayWindow();
                    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
                    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
                    if (!bVar2) {
                      __assert_fail("in.displayWindow () == header.displayWindow ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x103,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)
                              Imf_3_2::TiledRgbaInputFile::dataWindow();
                    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
                    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
                    if (!bVar2) {
                      __assert_fail("in.dataWindow () == header.dataWindow ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x104,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    fVar33 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
                    pfVar16 = (float *)Imf_3_2::Header::pixelAspectRatio();
                    if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                      __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x105,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
                    pfVar16 = (float *)Imf_3_2::Header::screenWindowCenter();
                    if (((((float)p3._sizeX != *pfVar16) || (NAN((float)p3._sizeX) || NAN(*pfVar16))
                         ) || (p3._sizeX._4_4_ != pfVar16[1])) ||
                       (NAN(p3._sizeX._4_4_) || NAN(pfVar16[1]))) {
                      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x106,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    fVar33 = (float)Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
                    pfVar16 = (float *)Imf_3_2::Header::screenWindowWidth();
                    if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                      __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x107,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    iVar3 = Imf_3_2::TiledRgbaInputFile::lineOrder();
                    piVar13 = (int *)Imf_3_2::Header::lineOrder();
                    if (iVar3 != *piVar13) {
                      __assert_fail("in.lineOrder () == header.lineOrder ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x108,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    iVar3 = Imf_3_2::TiledRgbaInputFile::compression();
                    piVar13 = (int *)Imf_3_2::Header::compression();
                    if (iVar3 != *piVar13) {
                      __assert_fail("in.compression () == header.compression ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x109,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    iVar3 = Imf_3_2::TiledRgbaInputFile::channels();
                    if (iVar3 != 0xf) {
                      __assert_fail("in.channels () == channels",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x10a,
                                    "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    for (uVar22 = 0; uVar22 != uVar18; uVar22 = uVar22 + 1) {
                      lVar28 = uVar22 * 0x18;
                      lVar31 = 0;
                      lVar32 = 0;
                      while( true ) {
                        iVar3 = Imf_3_2::TiledRgbaInputFile::levelHeight((int)&out);
                        if (iVar3 <= lVar32) break;
                        lVar27 = 0;
                        while (iVar3 = Imf_3_2::TiledRgbaInputFile::levelWidth((int)&out),
                              lVar27 < iVar3) {
                          lVar30 = *(long *)(p2._sizeY + 8 + lVar28) * lVar31 +
                                   *(long *)(p2._sizeY + 0x10 + lVar28);
                          fVar33 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar30 + lVar27 * 8) * 4);
                          lVar17 = *(long *)(p1._sizeY + 8 + lVar28) * lVar31 +
                                   *(long *)(p1._sizeY + 0x10 + lVar28);
                          pfVar16 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar17 + lVar27 * 8) * 4);
                          if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                            __assert_fail("(levels2[l])[y][x].r == (levels[l])[y][x].r",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x113,
                                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar33 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar30 + 2 + lVar27 * 8) * 4);
                          pfVar16 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar17 + 2 + lVar27 * 8) * 4);
                          if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                            __assert_fail("(levels2[l])[y][x].g == (levels[l])[y][x].g",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x118,
                                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar33 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar30 + 4 + lVar27 * 8) * 4);
                          pfVar16 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar17 + 4 + lVar27 * 8) * 4);
                          if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                            __assert_fail("(levels2[l])[y][x].b == (levels[l])[y][x].b",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x11d,
                                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                          fVar33 = *(float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar30 + 6 + lVar27 * 8) * 4);
                          lVar30 = lVar27 * 8;
                          lVar27 = lVar27 + 1;
                          pfVar16 = (float *)(_imath_half_to_float_table +
                                             (ulong)*(ushort *)(lVar17 + 6 + lVar30) * 4);
                          if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                            __assert_fail("(levels2[l])[y][x].a == (levels[l])[y][x].a",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x122,
                                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                         );
                          }
                        }
                        lVar32 = lVar32 + 1;
                        lVar31 = lVar31 + 8;
                      }
                    }
                    Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array
                              ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p2);
                    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
                    remove(_Var1._M_p);
                    Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array
                              ((Array<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p1);
                    Imf_3_2::Header::~Header(&header);
                    poVar10 = std::operator<<((ostream *)&std::cout,"levelMode 2");
                    poVar10 = std::operator<<(poVar10,", compression ");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,comp);
                    poVar10 = std::operator<<(poVar10,", tileSize ");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,xSize);
                    poVar10 = std::operator<<(poVar10,"x");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,ySize);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    _out = 0;
                    hStack_19e._h = 0;
                    hStack_19c._h = 0;
                    hStack_19a._h = 0;
                    Imf_3_2::Header::Header
                              (&header,W,H,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
                    puVar11 = (undefined4 *)Imf_3_2::Header::lineOrder();
                    *puVar11 = 0;
                    pCVar12 = (Compression *)Imf_3_2::Header::compression();
                    *pCVar12 = comp;
                    p1._sizeX = 0;
                    p1._sizeY = 0;
                    p1._data = (Rgba *)0x0;
                    std::operator<<((ostream *)&std::cout," writing");
                    std::ostream::flush();
                    remove(filename._M_dataplus._M_p);
                    iVar3 = Imf_3_2::globalThreadCount();
                    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                              (&out,filename._M_dataplus._M_p,&header,WRITE_RGBA,xSize,ySize,
                               RIPMAP_LEVELS,ROUND_UP,iVar3);
                    iVar3 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
                    iVar4 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
                    Imf_3_2::Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::resizeErase
                              ((Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p1,(long)iVar3,
                               (long)iVar4);
                    local_1c8 = 0;
                    for (lVar31 = 0; iVar3 = Imf_3_2::TiledRgbaOutputFile::numYLevels(),
                        lVar31 < iVar3; lVar31 = lVar31 + 1) {
                      lVar28 = 0;
                      for (lVar32 = 0; iVar3 = Imf_3_2::TiledRgbaOutputFile::numXLevels(),
                          lVar32 < iVar3; lVar32 = lVar32 + 1) {
                        iVar6 = (int)(Rgba *)&out;
                        iVar3 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar6);
                        iVar4 = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar6);
                        Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase
                                  ((Array2D<Imf_3_2::Rgba> *)
                                   ((long)&((p1._data)->r)._h + lVar28 + p1._sizeY * local_1c8),
                                   (long)iVar4,(long)iVar3);
                        fillPixels((Array2D<Imf_3_2::Rgba> *)
                                   ((long)&((p1._data)->r)._h + lVar28 + p1._sizeY * local_1c8),
                                   iVar3,iVar4);
                        Imf_3_2::TiledRgbaOutputFile::setFrameBuffer
                                  ((Rgba *)&out,
                                   *(ulong *)((long)&p1._data[2].r._h +
                                             p1._sizeY * local_1c8 + lVar28),1);
                        iVar3 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar6);
                        iVar4 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar6);
                        Imf_3_2::TiledRgbaOutputFile::writeTiles
                                  (iVar6,0,iVar3 + -1,0,iVar4 + -1,(int)lVar32);
                        lVar28 = lVar28 + 0x18;
                      }
                      local_1c8 = local_1c8 + 0x18;
                    }
                    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
                    std::operator<<((ostream *)&std::cout," reading");
                    std::ostream::flush();
                    iVar3 = Imf_3_2::globalThreadCount();
                    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                              ((TiledRgbaInputFile *)&out,filename._M_dataplus._M_p,iVar3);
                    piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
                    iVar3 = *piVar13;
                    iVar4 = piVar13[1];
                    uVar8 = Imf_3_2::TiledRgbaInputFile::numXLevels();
                    uVar5 = Imf_3_2::TiledRgbaInputFile::numYLevels();
                    Imf_3_2::Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::Array2D
                              ((Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p2,(long)(int)uVar5,
                               (long)(int)uVar8);
                    uVar22 = 0;
                    uVar18 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar18 = uVar22;
                    }
                    if ((int)uVar5 < 1) {
                      uVar5 = 0;
                    }
                    for (uVar21 = 0; uVar21 != uVar5; uVar21 = uVar21 + 1) {
                      iVar6 = 0;
                      for (lVar31 = 0; uVar18 * 0x18 != lVar31; lVar31 = lVar31 + 0x18) {
                        iVar25 = (int)(Rgba *)&out;
                        iVar7 = Imf_3_2::TiledRgbaInputFile::levelWidth(iVar25);
                        iVar9 = Imf_3_2::TiledRgbaInputFile::levelHeight(iVar25);
                        Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase
                                  ((Array2D<Imf_3_2::Rgba> *)
                                   ((long)&((p2._data)->r)._h + lVar31 + p2._sizeY * uVar22),
                                   (long)iVar9,(long)iVar7);
                        Imf_3_2::TiledRgbaInputFile::setFrameBuffer
                                  ((Rgba *)&out,
                                   *(long *)((long)&p2._data[1].r._h + p2._sizeY * uVar22 + lVar31)
                                   * -(long)iVar4 * 8 +
                                   *(long *)((long)&p2._data[2].r._h + p2._sizeY * uVar22 + lVar31)
                                   + (long)iVar3 * -8,1);
                        iVar7 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar25);
                        iVar9 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar25);
                        Imf_3_2::TiledRgbaInputFile::readTiles
                                  (iVar25,0,iVar7 + -1,0,iVar9 + -1,iVar6);
                        iVar6 = iVar6 + 1;
                      }
                      uVar22 = uVar22 + 0x18;
                    }
                    poVar10 = std::operator<<((ostream *)&std::cout," comparing");
                    std::endl<char,std::char_traits<char>>(poVar10);
                    std::ostream::flush();
                    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)
                              Imf_3_2::TiledRgbaInputFile::displayWindow();
                    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
                    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
                    if (!bVar2) {
                      __assert_fail("in.displayWindow () == header.displayWindow ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x182,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)
                              Imf_3_2::TiledRgbaInputFile::dataWindow();
                    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
                    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
                    if (!bVar2) {
                      __assert_fail("in.dataWindow () == header.dataWindow ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x183,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    fVar33 = (float)Imf_3_2::TiledRgbaInputFile::pixelAspectRatio();
                    pfVar16 = (float *)Imf_3_2::Header::pixelAspectRatio();
                    if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                      __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x184,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    Imf_3_2::TiledRgbaInputFile::screenWindowCenter();
                    pfVar16 = (float *)Imf_3_2::Header::screenWindowCenter();
                    if (((((float)p3._sizeX != *pfVar16) || (NAN((float)p3._sizeX) || NAN(*pfVar16))
                         ) || (p3._sizeX._4_4_ != pfVar16[1])) ||
                       (NAN(p3._sizeX._4_4_) || NAN(pfVar16[1]))) {
                      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x185,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    fVar33 = (float)Imf_3_2::TiledRgbaInputFile::screenWindowWidth();
                    pfVar16 = (float *)Imf_3_2::Header::screenWindowWidth();
                    if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                      __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x186,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    iVar3 = Imf_3_2::TiledRgbaInputFile::lineOrder();
                    piVar13 = (int *)Imf_3_2::Header::lineOrder();
                    if (iVar3 != *piVar13) {
                      __assert_fail("in.lineOrder () == header.lineOrder ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x187,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    iVar3 = Imf_3_2::TiledRgbaInputFile::compression();
                    piVar13 = (int *)Imf_3_2::Header::compression();
                    if (iVar3 != *piVar13) {
                      __assert_fail("in.compression () == header.compression ()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x188,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    iVar3 = Imf_3_2::TiledRgbaInputFile::channels();
                    if (iVar3 != 0xf) {
                      __assert_fail("in.channels () == channels",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x189,
                                    "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                   );
                    }
                    for (uVar22 = 0; uVar22 != uVar5; uVar22 = uVar22 + 1) {
                      for (uVar21 = 0; uVar21 != uVar18; uVar21 = uVar21 + 1) {
                        lVar32 = 0;
                        lVar31 = 0;
                        while( true ) {
                          iVar3 = Imf_3_2::TiledRgbaInputFile::levelHeight((int)&out);
                          if (iVar3 <= lVar31) break;
                          lVar28 = 0;
                          while (iVar3 = Imf_3_2::TiledRgbaInputFile::levelWidth((int)&out),
                                lVar28 < iVar3) {
                            lVar27 = (long)p2._data[p2._sizeY * uVar22 * 3 + uVar21 * 3 + 1] *
                                     lVar32 + (long)p2._data[p2._sizeY * uVar22 * 3 + uVar21 * 3 + 2
                                                            ];
                            fVar33 = *(float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar27 + lVar28 * 8) * 4);
                            lVar30 = (long)p1._data[p1._sizeY * uVar22 * 3 + uVar21 * 3 + 1] *
                                     lVar32 + (long)p1._data[p1._sizeY * uVar22 * 3 + uVar21 * 3 + 2
                                                            ];
                            pfVar16 = (float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar30 + lVar28 * 8) * 4);
                            if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                              __assert_fail("(levels2[ly][lx])[y][x].r == (levels[ly][lx])[y][x].r",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x196,
                                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                           );
                            }
                            fVar33 = *(float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar27 + 2 + lVar28 * 8) * 4);
                            pfVar16 = (float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar30 + 2 + lVar28 * 8) * 4);
                            if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                              __assert_fail("(levels2[ly][lx])[y][x].g == (levels[ly][lx])[y][x].g",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x19d,
                                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                           );
                            }
                            fVar33 = *(float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar27 + 4 + lVar28 * 8) * 4);
                            pfVar16 = (float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar30 + 4 + lVar28 * 8) * 4);
                            if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                              __assert_fail("(levels2[ly][lx])[y][x].b == (levels[ly][lx])[y][x].b",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x1a4,
                                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                           );
                            }
                            fVar33 = *(float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar27 + 6 + lVar28 * 8) * 4);
                            lVar27 = lVar28 * 8;
                            lVar28 = lVar28 + 1;
                            pfVar16 = (float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar30 + 6 + lVar27) * 4);
                            if ((fVar33 != *pfVar16) || (NAN(fVar33) || NAN(*pfVar16))) {
                              __assert_fail("(levels2[ly][lx])[y][x].a == (levels[ly][lx])[y][x].a",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x1ab,
                                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                                           );
                            }
                          }
                          lVar31 = lVar31 + 1;
                          lVar32 = lVar32 + 8;
                        }
                      }
                    }
                    Imf_3_2::Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array2D
                              ((Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p2);
                    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
                    remove(filename._M_dataplus._M_p);
                    Imf_3_2::Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_>::~Array2D
                              ((Array2D<Imf_3_2::Array2D<Imf_3_2::Rgba>_> *)&p1);
                    Imf_3_2::Header::~Header(&header);
                  }
                  std::__cxx11::string::~string((string *)&filename);
                  return;
                }
                __assertion = "in.channels () == channels";
                uVar5 = 0x6d;
              }
              else {
                __assertion = "in.compression () == header.compression ()";
                uVar5 = 0x6c;
              }
            }
            else {
              __assertion = "in.lineOrder () == header.lineOrder ()";
              uVar5 = 0x6b;
            }
          }
        }
      }
    }
    else {
      __assertion = "in.dataWindow () == header.dataWindow ()";
      uVar5 = 0x67;
    }
  }
  else {
    __assertion = "in.displayWindow () == header.displayWindow ()";
    uVar5 = 0x66;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                ,uVar5,
                "void (anonymous namespace)::writeReadRGBAONE(const char *, int, int, RgbaChannels, Compression, int, int)"
               );
}

Assistant:

void
writeRead (
    const std::string& tempDir,
    int                W,
    int                H,
    Compression        comp,
    int                xSize,
    int                ySize)
{
    std::string filename = tempDir + "imf_test_tiled_rgba.exr";

    writeReadRGBAONE (filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

    if (comp != B44_COMPRESSION && comp != B44A_COMPRESSION &&
        comp != DWAA_COMPRESSION && comp != DWAB_COMPRESSION)
    {
        //
        // Skip mipmaps and ripmaps with B44 or DWA compression; writing
        // an image with a single resolution level, above, should be enough
        // to verify that B44 and DWA compression work with tiled files.
        //

        writeReadRGBAMIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);

        writeReadRGBARIP (
            filename.c_str (), W, H, WRITE_RGBA, comp, xSize, ySize);
    }
}